

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeShape.cpp
# Opt level: O3

btVector3 __thiscall btConeShape::localGetSupportingVertex(btConeShape *this,btVector3 *vec)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  btScalar abVar3 [4];
  uint uVar4;
  float extraout_XMM0_Da;
  float fVar5;
  float extraout_XMM0_Da_00;
  float fVar7;
  undefined1 auVar6 [16];
  undefined1 auVar13 [12];
  undefined8 in_XMM1_Qa;
  undefined8 uVar14;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  btVector3 bVar12;
  float local_48;
  float fStack_44;
  
  bVar12 = coneLocalSupport(this,vec);
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])(this);
  if ((extraout_XMM0_Da != 0.0) || (NAN(extraout_XMM0_Da))) {
    fVar11 = vec->m_floats[2];
    uVar1 = *(ulong *)vec->m_floats;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar1;
    fVar5 = (float)(uVar1 >> 0x20);
    fVar5 = fVar11 * fVar11 + (float)uVar1 * (float)uVar1 + fVar5 * fVar5;
    uVar4 = (uint)(fVar5 < 1.4210855e-14);
    auVar6._0_4_ = (int)(uVar4 << 0x1f) >> 0x1f;
    auVar6._4_4_ = (int)(uVar4 << 0x1f) >> 0x1f;
    auVar6._8_8_ = 0;
    auVar6 = auVar6 & _DAT_001f04c0 | ~auVar6 & auVar8;
    if (fVar5 < 1.4210855e-14) {
      fVar11 = -1.0;
    }
    fVar5 = auVar6._0_4_;
    fVar7 = auVar6._4_4_;
    fVar10 = 1.0 / SQRT(fVar11 * fVar11 + fVar5 * fVar5 + fVar7 * fVar7);
    (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
      _vptr_btCollisionShape[0xc])(this);
    local_48 = bVar12.m_floats[0];
    fStack_44 = bVar12.m_floats[1];
    abVar3[1] = fStack_44 + extraout_XMM0_Da_00 * fVar10 * fVar7;
    abVar3[0] = local_48 + extraout_XMM0_Da_00 * fVar10 * fVar5;
    auVar2._8_8_ = in_XMM1_Qa;
    auVar2._0_8_ = bVar12.m_floats._8_8_;
    auVar9._4_12_ = auVar2._4_12_;
    auVar9._0_4_ = bVar12.m_floats[2] + fVar11 * fVar10 * extraout_XMM0_Da_00;
    abVar3[2] = (btScalar)(int)auVar9._0_8_;
    abVar3[3] = (btScalar)(int)((ulong)auVar9._0_8_ >> 0x20);
    bVar12.m_floats = abVar3;
  }
  bVar12.m_floats[0] = bVar12.m_floats[0];
  auVar13._4_4_ = bVar12.m_floats[1];
  register0x00001240 = bVar12.m_floats[2];
  register0x00001244 = bVar12.m_floats[3];
  return (btVector3)bVar12.m_floats;
}

Assistant:

btVector3	btConeShape::localGetSupportingVertex(const btVector3& vec)  const
{
	btVector3 supVertex = coneLocalSupport(vec);
	if ( getMargin()!=btScalar(0.) )
	{
		btVector3 vecnorm = vec;
		if (vecnorm .length2() < (SIMD_EPSILON*SIMD_EPSILON))
		{
			vecnorm.setValue(btScalar(-1.),btScalar(-1.),btScalar(-1.));
		} 
		vecnorm.normalize();
		supVertex+= getMargin() * vecnorm;
	}
	return supVertex;
}